

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

string * __thiscall
flatbuffers::python::(anonymous_namespace)::PythonStubGenerator::UnionType_abi_cxx11_
          (string *__return_storage_ptr__,PythonStubGenerator *this,EnumDef *enum_def,
          Imports *imports)

{
  BaseType BVar1;
  pointer ppEVar2;
  EnumVal *pEVar3;
  Import *pIVar4;
  pointer ppEVar5;
  string result;
  Import import;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  Import local_b0;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"typing",(allocator<char> *)&local_d0);
  Imports::Import(imports,&local_b0.module);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"",(allocator<char> *)&local_b0);
  ppEVar2 = (enum_def->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar5 = (enum_def->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppEVar5 != ppEVar2;
      ppEVar5 = ppEVar5 + 1) {
    pEVar3 = *ppEVar5;
    if (local_d0._M_string_length != 0) {
      std::__cxx11::string::append((char *)&local_d0);
    }
    BVar1 = (pEVar3->union_type).base_type;
    if ((BVar1 == BASE_TYPE_NONE) || (BVar1 == BASE_TYPE_STRING)) {
      std::__cxx11::string::append((char *)&local_d0);
    }
    else if (BVar1 == BASE_TYPE_STRUCT) {
      anon_unknown_0::PythonStubGenerator::ModuleFor<flatbuffers::StructDef>
                (&local_70,(PythonStubGenerator *)this,(pEVar3->union_type).struct_def);
      (**(code **)(*(long *)(this + 8) + 0x78))(&local_50,this + 8,(pEVar3->union_type).struct_def);
      pIVar4 = Imports::Import(imports,&local_70,&local_50);
      Import::Import(&local_b0,pIVar4);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((string *)&local_d0);
      Import::~Import(&local_b0);
    }
  }
  std::operator+(&local_b0.module,"typing.Union[",&local_d0);
  std::operator+(__return_storage_ptr__,&local_b0.module,"]");
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  return __return_storage_ptr__;
}

Assistant:

std::string UnionType(const EnumDef &enum_def, Imports *imports) const {
    return UnionType(enum_def, imports, [this](const StructDef &struct_def) {
      return namer_.Type(struct_def);
    });
  }